

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_test.c
# Opt level: O0

void test_address_busy(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_socket s2;
  nng_socket s1;
  nng_dialer d;
  nng_listener l;
  char *a;
  
  memset(&s1,0,4);
  memset(&s2,0,4);
  nVar1 = nng_pair1_open((nng_socket *)&result_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                         ,0xdd,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_pair1_open((nng_socket *)&result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                         ,0xde,"%s: expected success, got %s (%d)","nng_pair1_open(&(s2))",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  iVar2 = nng_listener_id((nng_listener)s1.id);
  acutest_check_((uint)(iVar2 < 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                 ,0xe0,"%s","nng_listener_id(l) < 0");
  nVar1 = nng_listen((nng_socket)result_,"inproc://eaddrinuse",(nng_listener *)&s1,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                         ,0xe1,"%s: expected success, got %s (%d)","nng_listen(s1, a, &l, 0)",pcVar3
                         ,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  iVar2 = nng_listener_id((nng_listener)s1.id);
  acutest_check_((uint)(0 < iVar2),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                 ,0xe2,"%s","nng_listener_id(l) > 0");
  nVar1 = nng_listen((nng_socket)result_,"inproc://eaddrinuse",(nng_listener *)0x0,0);
  pcVar3 = nng_strerror(NNG_EADDRINUSE);
  acutest_check_((uint)(nVar1 == NNG_EADDRINUSE),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                 ,0xe5,"%s fails with %s","nng_listen(s1, a, NULL, 0)",pcVar3);
  pcVar3 = nng_strerror(NNG_EADDRINUSE);
  pcVar4 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_listen(s1, a, NULL, 0)",pcVar3,10,pcVar4
                   ,(ulong)nVar1);
  nVar1 = nng_listener_start((nng_listener)s1.id,0);
  pcVar3 = nng_strerror(NNG_ESTATE);
  acutest_check_((uint)(nVar1 == NNG_ESTATE),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                 ,0xe8,"%s fails with %s","nng_listener_start(l, 0)",pcVar3);
  pcVar3 = nng_strerror(NNG_ESTATE);
  pcVar4 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_listener_start(l, 0)",pcVar3,0xb,pcVar4,
                   (ulong)nVar1);
  iVar2 = nng_dialer_id((nng_dialer)s2.id);
  acutest_check_((uint)(iVar2 < 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                 ,0xeb,"%s","nng_dialer_id(d) < 0");
  nVar1 = nng_dial((nng_socket)result__1,"inproc://eaddrinuse",(nng_dialer *)&s2,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                         ,0xec,"%s: expected success, got %s (%d)","nng_dial(s2, a, &d, 0)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  iVar2 = nng_dialer_id((nng_dialer)s2.id);
  acutest_check_((uint)(0 < iVar2),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                 ,0xed,"%s","nng_dialer_id(d) > 0");
  nVar1 = nng_socket_close((nng_socket)result_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                         ,0xef,"%s: expected success, got %s (%d)","nng_socket_close(s1)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_close((nng_socket)result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                         ,0xf0,"%s: expected success, got %s (%d)","nng_socket_close(s2)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  return;
}

Assistant:

void
test_address_busy(void)
{
	char        *a = "inproc://eaddrinuse";
	nng_listener l = NNG_LISTENER_INITIALIZER;
	nng_dialer   d = NNG_DIALER_INITIALIZER;
	nng_socket   s1;
	nng_socket   s2;

	NUTS_OPEN(s1);
	NUTS_OPEN(s2);

	NUTS_TRUE(nng_listener_id(l) < 0);
	NUTS_PASS(nng_listen(s1, a, &l, 0));
	NUTS_TRUE(nng_listener_id(l) > 0);

	// Cannot start another one.
	NUTS_FAIL(nng_listen(s1, a, NULL, 0), NNG_EADDRINUSE);

	// We can't restart it -- it's already running
	NUTS_FAIL(nng_listener_start(l, 0), NNG_ESTATE);

	// We can connect to it.
	NUTS_TRUE(nng_dialer_id(d) < 0);
	NUTS_PASS(nng_dial(s2, a, &d, 0));
	NUTS_TRUE(nng_dialer_id(d) > 0);

	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
}